

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O3

mempool * memory_allocate_mempool(uint32_t num_entries,uint32_t entry_size)

{
  long lVar1;
  mempool *pmVar2;
  uintptr_t *puVar3;
  undefined8 extraout_RAX;
  ulong extraout_RDX;
  long lVar4;
  ulong uVar5;
  undefined4 in_register_00000034;
  long lVar6;
  undefined4 in_register_0000003c;
  long *plVar7;
  mempool *pmVar8;
  uint uVar9;
  uint uVar10;
  uintptr_t *virt;
  dma_memory dVar11;
  
  plVar7 = (long *)CONCAT44(in_register_0000003c,num_entries);
  lVar6 = CONCAT44(in_register_00000034,entry_size);
  uVar9 = 0x800;
  if (entry_size != 0) {
    uVar9 = entry_size;
  }
  if ((VFIO_CONTAINER_FILE_DESCRIPTOR == -1) && ((int)(0x200000 % (ulong)uVar9) != 0)) {
    memory_allocate_mempool_cold_1();
    uVar9 = *(uint *)(plVar7 + 2);
    pmVar8 = (mempool *)(extraout_RDX & 0xffffffff);
    pmVar2 = (mempool *)(ulong)uVar9;
    if (uVar9 < (uint)extraout_RDX) {
      fprintf(_stderr,"[WARN ] %s:%d %s(): memory pool %p only has %d free bufs, requested %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/memory.c",0x7d,
              "pkt_buf_alloc_batch",plVar7,(mempool *)(ulong)uVar9,pmVar8,extraout_RAX);
      pmVar8 = (mempool *)(ulong)*(uint *)(plVar7 + 2);
      pmVar2 = pmVar8;
    }
    if ((int)pmVar8 != 0) {
      lVar1 = plVar7[1];
      lVar4 = 0;
      do {
        uVar9 = (int)pmVar2 - 1;
        pmVar2 = (mempool *)(ulong)uVar9;
        *(ulong *)(lVar6 + lVar4) =
             (ulong)(uint)(*(int *)((long)plVar7 + (long)pmVar2 * 4 + 0x14) * (int)lVar1) + *plVar7;
        lVar4 = lVar4 + 8;
      } while ((long)pmVar8 << 3 != lVar4);
      *(uint *)(plVar7 + 2) = uVar9;
    }
    return pmVar8;
  }
  pmVar2 = (mempool *)malloc((ulong)num_entries * 4 + 0x18);
  uVar10 = 0;
  dVar11 = memory_allocate_dma((ulong)(uVar9 * num_entries),false);
  pmVar2->num_entries = num_entries;
  pmVar2->buf_size = uVar9;
  pmVar2->base_addr = dVar11.virt;
  pmVar2->free_stack_top = num_entries;
  if (num_entries != 0) {
    uVar5 = 0;
    do {
      *(int *)(&pmVar2->field_0x14 + uVar5 * 4) = (int)uVar5;
      virt = (uintptr_t *)((ulong)uVar10 + (long)pmVar2->base_addr);
      puVar3 = virt;
      if (VFIO_CONTAINER_FILE_DESCRIPTOR == -1) {
        puVar3 = (uintptr_t *)virt_to_phys(virt);
      }
      *virt = (uintptr_t)puVar3;
      *(int *)(virt + 2) = (int)uVar5;
      uVar5 = uVar5 + 1;
      uVar10 = uVar10 + uVar9;
      virt[1] = (uintptr_t)pmVar2;
      *(undefined4 *)((long)virt + 0x14) = 0;
    } while (num_entries != uVar5);
  }
  return pmVar2;
}

Assistant:

struct mempool* memory_allocate_mempool(uint32_t num_entries, uint32_t entry_size) {
	entry_size = entry_size ? entry_size : 2048;
	// require entries that neatly fit into the page size, this makes the memory pool much easier
	// otherwise our base_addr + index * size formula would be wrong because we can't cross a page-boundary
	if ((VFIO_CONTAINER_FILE_DESCRIPTOR == -1) && HUGE_PAGE_SIZE % entry_size) {
		error("entry size must be a divisor of the huge page size (%d)", HUGE_PAGE_SIZE);
	}
	struct mempool* mempool = (struct mempool*) malloc(sizeof(struct mempool) + num_entries * sizeof(uint32_t));
	struct dma_memory mem = memory_allocate_dma(num_entries * entry_size, false);
	mempool->num_entries = num_entries;
	mempool->buf_size = entry_size;
	mempool->base_addr = mem.virt;
	mempool->free_stack_top = num_entries;
	for (uint32_t i = 0; i < num_entries; i++) {
		mempool->free_stack[i] = i;
		struct pkt_buf* buf = (struct pkt_buf*) (((uint8_t*) mempool->base_addr) + i * entry_size);
		if (VFIO_CONTAINER_FILE_DESCRIPTOR != -1) {
			// "physical" memory is iova address which is identity mapped to vaddr
			buf->buf_addr_phy = (uintptr_t) buf;
		} else {
			// physical addresses are not contiguous within a pool, we need to get the mapping
			// minor optimization opportunity: this only needs to be done once per page
			buf->buf_addr_phy = virt_to_phys(buf);
		}
		buf->mempool_idx = i;
		buf->mempool = mempool;
		buf->size = 0;
	}
	return mempool;
}